

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O2

string * __thiscall
leveldb::ParsedInternalKey::DebugString_abi_cxx11_
          (string *__return_storage_ptr__,ParsedInternalKey *this)

{
  long lVar1;
  ostream *poVar2;
  Slice *value;
  long in_FS_OFFSET;
  pointer local_1e8;
  size_type sStack_1e0;
  string local_1d8;
  string local_1b8;
  ostringstream ss;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  poVar2 = std::operator<<((ostream *)&ss,'\'');
  Slice::ToString_abi_cxx11_(&local_1d8,&this->user_key);
  local_1e8 = local_1d8._M_dataplus._M_p;
  sStack_1e0 = local_1d8._M_string_length;
  EscapeString_abi_cxx11_(&local_1b8,(leveldb *)&local_1e8,value);
  poVar2 = std::operator<<(poVar2,(string *)&local_1b8);
  poVar2 = std::operator<<(poVar2,"\' @ ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," : ");
  std::ostream::operator<<(poVar2,this->type);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string ParsedInternalKey::DebugString() const {
  std::ostringstream ss;
  ss << '\'' << EscapeString(user_key.ToString()) << "' @ " << sequence << " : "
     << static_cast<int>(type);
  return ss.str();
}